

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall
CholeskyFactor::eliminate
          (CholeskyFactor *this,vector<double,_std::allocator<double>_> *m,HighsInt i,HighsInt j,
          HighsInt kmax,HighsInt currentk)

{
  double dVar1;
  pointer pdVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  iVar4 = j * kmax;
  pdVar2 = (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar2[iVar4 + i];
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return;
  }
  iVar6 = kmax * i;
  dVar8 = pdVar2[i + iVar6];
  dVar9 = SQRT(dVar8 * dVar8 + dVar1 * dVar1);
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar8 = dVar8 / dVar9;
    dVar9 = -dVar1 / dVar9;
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      if ((dVar8 != 0.0) || (NAN(dVar8))) {
        uVar7 = 0;
        uVar5 = (ulong)(uint)this->current_k;
        if (this->current_k < 1) {
          uVar5 = uVar7;
        }
        for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          dVar1 = pdVar2[(long)iVar6 + uVar7];
          pdVar2[(long)iVar6 + uVar7] = dVar8 * dVar1 + pdVar2[(long)iVar4 + uVar7] * -dVar9;
          pdVar2[(long)iVar4 + uVar7] = dVar1 * dVar9 + pdVar2[(long)iVar4 + uVar7] * dVar8;
        }
      }
      else {
        uVar5 = 0;
        if (0 < this->current_k) {
          uVar5 = (ulong)(uint)this->current_k;
        }
        uVar7 = 0;
        if (dVar9 <= 0.0) {
          for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            dVar1 = pdVar2[(long)iVar6 + uVar7];
            pdVar2[(long)iVar6 + uVar7] = pdVar2[(long)iVar4 + uVar7];
            pdVar2[(long)iVar4 + uVar7] = -dVar1;
          }
        }
        else {
          for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            dVar1 = pdVar2[(long)iVar6 + uVar7];
            pdVar2[(long)iVar6 + uVar7] = -pdVar2[(long)iVar4 + uVar7];
            pdVar2[(long)iVar4 + uVar7] = dVar1;
          }
        }
      }
    }
    else if (dVar8 <= 0.0) {
      uVar5 = 0;
      uVar3 = this->current_k;
      if (this->current_k < 1) {
        uVar3 = 0;
      }
      for (; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        pdVar2[(long)iVar6 + uVar5] = -pdVar2[(long)iVar6 + uVar5];
        pdVar2[(long)iVar4 + uVar5] = -pdVar2[(long)iVar4 + uVar5];
      }
    }
  }
  (m->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar4 + i] = 0.0;
  return;
}

Assistant:

void eliminate(std::vector<double>& m, HighsInt i, HighsInt j, HighsInt kmax,
                 HighsInt currentk) {
    // i = col, j = row
    if (m[j * kmax + i] == 0.0) {
      return;
    }
    double z = sqrt(m[i * kmax + i] * m[i * kmax + i] +
                    m[j * kmax + i] * m[j * kmax + i]);
    double cos_, sin_;
    if (z == 0) {
      cos_ = 1.0;
      sin_ = 0.0;
    } else {
      cos_ = m[i * kmax + i] / z;
      sin_ = -m[j * kmax + i] / z;
    }

    if (sin_ == 0.0) {
      if (cos_ > 0.0) {
        // nothing
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -a_ik;
          m[j * kmax + k] = -m[j * kmax + k];
        }
      }
    } else if (cos_ == 0.0) {
      if (sin_ > 0.0) {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -m[j * kmax + k];
          m[j * kmax + k] = a_ik;
        }
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = m[j * kmax + k];
          m[j * kmax + k] = -a_ik;
        }
      }
    } else {
      // #pragma omp parallel for
      for (HighsInt k = 0; k < current_k; k++) {
        // update entry i and j of column k
        double a_ik = m[i * kmax + k];
        // entry i
        m[i * kmax + k] = cos_ * a_ik - sin_ * m[j * kmax + k];
        m[j * kmax + k] = sin_ * a_ik + cos_ * m[j * kmax + k];
      }
    }
    m[j * kmax + i] = 0.0;
  }